

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_move_semantics.cpp
# Opt level: O3

Useless * __thiscall L18_1::Useless::operator=(Useless *this,Useless *f)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"move assignment operator called:\n",0x21);
  if (this != f) {
    if (this->pc != (char *)0x0) {
      operator_delete__(this->pc);
    }
    this->n = f->n;
    this->pc = f->pc;
    f->n = 0;
    f->pc = (char *)0x0;
  }
  return this;
}

Assistant:

Useless& Useless::operator=(L18_1::Useless &&f) {
        cout << "move assignment operator called:\n";
        //  wtf could this be same?
        if (this == &f) {
            return * this;
        }

        delete [] pc;
        n = f.n;
        //  transfer ownership
        pc = f.pc;

        //  clear f's content
        f.n = 0;
        f.pc = nullptr;
        return *this;
    }